

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

void destroy_bfile_t(bfile_t *bfile)

{
  ushort *in_RDI;
  
  if (in_RDI != (ushort *)0x0) {
    if (*(long *)(in_RDI + 0x14) != 0) {
      free(*(void **)(in_RDI + 0x14));
      in_RDI[0x14] = 0;
      in_RDI[0x15] = 0;
      in_RDI[0x16] = 0;
      in_RDI[0x17] = 0;
    }
    if ((*(long *)(in_RDI + 0x18) != 0) && ((*in_RDI & 0x400) == 0)) {
      free(*(void **)(in_RDI + 0x18));
      in_RDI[0x18] = 0;
      in_RDI[0x19] = 0;
      in_RDI[0x1a] = 0;
      in_RDI[0x1b] = 0;
    }
    free(in_RDI);
  }
  return;
}

Assistant:

static
void
destroy_bfile_t(
    bfile_t * bfile )
{
  if ( bfile != NULL ) {
    if ( bfile->filename != NULL ) {
      free( bfile->filename );
      bfile->filename = NULL;
    }
    if ( (bfile->buffer != NULL) && !(bfile->flags & BF_MEMBUFFER)) {
      free( bfile->buffer );
      bfile->buffer = NULL;
    }
    free( bfile );
  }
}